

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O1

void __thiscall METADemuxer::METADemuxer(METADemuxer *this,BufferedReaderManager *readManager)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_AbstractDemuxer).m_pidFilters._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_AbstractDemuxer).m_fileBlockSize = 0x200000;
  (this->super_AbstractDemuxer).m_timeOffset = 0;
  (this->super_AbstractDemuxer)._vptr_AbstractDemuxer = (_func_int **)&PTR__METADemuxer_002411b0;
  (this->m_iterators).super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).super__Vector_base<FileListIterator_*,_std::allocator<FileListIterator_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ContainerToReaderWrapper::ContainerToReaderWrapper(&this->m_containerReader,this,readManager);
  (this->m_lastReportTime).__d.__r = 0;
  this->m_readManager = readManager;
  (this->m_streamName)._M_dataplus._M_p = (pointer)&(this->m_streamName).field_2;
  (this->m_streamName)._M_string_length = 0;
  (this->m_streamName).field_2._M_local_buf[0] = '\0';
  (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_codecInfo).super__Vector_base<StreamInfo,_std::allocator<StreamInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header;
  (this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->m_mplsStreamMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_processedTracks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_flushDataMode = false;
  this->m_HevcFound = false;
  this->m_totalSize = 0;
  this->m_lastProgressY = 0;
  this->m_lastReadRez = 0;
  return;
}

Assistant:

METADemuxer::METADemuxer(const BufferedReaderManager& readManager)
    : m_containerReader(*this, readManager), m_readManager(readManager)
{
    m_flushDataMode = false;
    m_HevcFound = false;
    m_totalSize = 0;
    m_lastProgressY = 0;
    m_lastReadRez = 0;
}